

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O3

void enet_peer_reset_outgoing_commands(ENetList *queue)

{
  _ENetListNode **pp_Var1;
  _ENetListNode *p_Var2;
  _ENetListNode *p_Var3;
  _ENetListNode *p_Var4;
  
  p_Var2 = (queue->sentinel).next;
  while (p_Var2 != &queue->sentinel) {
    p_Var3 = ((ENetListNode *)&p_Var2->next)->next;
    p_Var4 = p_Var2->previous;
    p_Var4->next = p_Var3;
    p_Var3->previous = p_Var4;
    p_Var3 = p_Var2[5].previous;
    if (p_Var3 != (_ENetListNode *)0x0) {
      pp_Var1 = &p_Var3[1].previous;
      *(int *)pp_Var1 = *(int *)pp_Var1 + -1;
      if (*(int *)pp_Var1 == 0) {
        if (p_Var3[1].next != (_ENetListNode *)0x0) {
          (*(code *)p_Var3[1].next)(p_Var3);
        }
        (*(code *)callbacks_1)(p_Var3);
      }
    }
    (*(code *)callbacks_1)(p_Var2);
    p_Var2 = (queue->sentinel).next;
  }
  return;
}

Assistant:

static void enet_peer_reset_outgoing_commands(ENetList* queue) {
	ENetOutgoingCommand* outgoingCommand;

	while (!enet_list_empty(queue)) {
		outgoingCommand = (ENetOutgoingCommand*)enet_list_remove(enet_list_begin(queue));

		if (outgoingCommand->packet != NULL) {
			--outgoingCommand->packet->referenceCount;

			if (outgoingCommand->packet->referenceCount == 0)
				enet_packet_destroy(outgoingCommand->packet);
		}

		enet_free(outgoingCommand);
	}
}